

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::TrackInlineeArgLifetimes(LinearScan *this,Instr *instr)

{
  uint32 uVar1;
  int iVar2;
  InlineeFrameInfo *pIVar3;
  ArgList *pAVar4;
  Type pIVar5;
  Lifetime *pLVar6;
  StackSym *pSVar7;
  anon_union_8_3_6c1fdb8e_for_scratch aVar8;
  LoweredBasicBlock *pLVar9;
  code *pcVar10;
  bool bVar11;
  undefined4 *puVar12;
  Func **ppFVar13;
  JITTimeFunctionBody *this_00;
  intptr_t functionBodyAddr;
  Func *pFVar14;
  char *message;
  char *error;
  long lVar15;
  uint lineNumber;
  char *fileName;
  long lVar16;
  uint *key;
  uint uVar17;
  long lVar18;
  SymID *key_00;
  anon_class_8_1_8991fb9c_for_callback local_40;
  uint *value;
  int i;
  
  if (instr->m_opcode != InlineeEnd) {
    if (instr->m_opcode == InlineeStart) {
      pFVar14 = instr->m_func;
      if ((pFVar14->field_0x240 & 2) != 0) {
        pIVar3 = pFVar14->frameInfo;
        pAVar4 = pIVar3->arguments;
        if (0 < (pAVar4->
                super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                ).count) {
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          lVar15 = 0;
          lVar18 = 0;
          do {
            pIVar5 = (pAVar4->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).buffer;
            if (*(int *)((long)&pIVar5->type + lVar15) == 1) {
              lVar16 = *(long *)((long)&pIVar5->field_1 + lVar15);
              pLVar6 = *(Lifetime **)(lVar16 + 0x48);
              pLVar9 = this->currentBlock;
              JsUtil::
              List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::EnsureArray(&pLVar9->inlineeFrameLifetimes,0);
              iVar2 = (pLVar9->inlineeFrameLifetimes).
                      super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.
                      count;
              (pLVar9->inlineeFrameLifetimes).
              super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer
              [iVar2] = pLVar6;
              (pLVar9->inlineeFrameLifetimes).
              super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count =
                   iVar2 + 1;
              key = (uint *)(lVar16 + 0x10);
              bVar11 = JsUtil::
                       BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ::TryGetReference<unsigned_int>
                                 (&this->currentBlock->inlineeFrameSyms,key,(uint **)&local_40,
                                  (int *)&value);
              if (bVar11) {
                *(int *)&(local_40.this)->func = *(int *)&(local_40.this)->func + 1;
              }
              else {
                value = (uint *)CONCAT44(value._4_4_,1);
                JsUtil::
                BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                          ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)&this->currentBlock->inlineeFrameSyms,key,(uint *)&value);
              }
            }
            if (*(int *)((long)&pIVar5->type + lVar15) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                                  ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                                  "value.type != InlineeFrameInfoValueType_None");
              if (!bVar11) goto LAB_0058f25c;
              *puVar12 = 0;
            }
            lVar18 = lVar18 + 1;
            lVar15 = lVar15 + 0x18;
          } while (lVar18 < (pAVar4->
                            super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                            ).count);
        }
        if ((pIVar3->function).type == InlineeFrameInfoValueType_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                              ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                              "function.type != InlineeFrameInfoValueType_None");
          if (!bVar11) goto LAB_0058f25c;
          *puVar12 = 0;
        }
        if ((pIVar3->function).type == InlineeFrameInfoValueType_Sym) {
          pSVar7 = (pIVar3->function).field_1.sym;
          aVar8 = pSVar7->scratch;
          pLVar9 = this->currentBlock;
          JsUtil::
          List<Lifetime_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::EnsureArray(&pLVar9->inlineeFrameLifetimes,0);
          iVar2 = (pLVar9->inlineeFrameLifetimes).
                  super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count;
          *(anon_union_8_3_6c1fdb8e_for_scratch *)
           ((pLVar9->inlineeFrameLifetimes).
            super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer +
           iVar2) = aVar8;
          (pLVar9->inlineeFrameLifetimes).
          super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count =
               iVar2 + 1;
          key_00 = &(pSVar7->super_Sym).m_id;
          bVar11 = JsUtil::
                   BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::TryGetReference<unsigned_int>
                             (&this->currentBlock->inlineeFrameSyms,key_00,(uint **)&local_40,
                              (int *)&value);
          if (bVar11) {
            *(int *)&(local_40.this)->func = *(int *)&(local_40.this)->func + 1;
          }
          else {
            value = (uint *)CONCAT44(value._4_4_,1);
            JsUtil::
            BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->currentBlock->inlineeFrameSyms,key_00,(uint *)&value);
          }
        }
        if ((0 < (this->currentBlock->inlineeStack).
                 super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count) &&
           (uVar17 = instr->m_func->inlineDepth,
           ppFVar13 = JsUtil::
                      List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Last(&this->currentBlock->inlineeStack), uVar17 <= (*ppFVar13)->inlineDepth)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar12 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                              ,0xd8f,
                              "(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth)"
                              ,
                              "instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth"
                             );
          if (!bVar11) goto LAB_0058f25c;
          *puVar12 = 0;
        }
LAB_0058f225:
        pLVar9 = this->currentBlock;
        JsUtil::
        List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray(&pLVar9->inlineeStack,0);
        iVar2 = (pLVar9->inlineeStack).
                super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count;
        (pLVar9->inlineeStack).
        super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer[iVar2] =
             instr->m_func;
        (pLVar9->inlineeStack).
        super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count = iVar2 + 1;
        return;
      }
      if ((pFVar14->parentFunc->field_0x240 & 2) == 0) {
        return;
      }
      if (pFVar14->frameInfo != (InlineeFrameInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                            ,0xd95,"(!instr->m_func->frameInfo)","!instr->m_func->frameInfo");
        if (!bVar11) goto LAB_0058f25c;
        *puVar12 = 0;
      }
      if (instr->m_func->cachedInlineeFrameInfo == (InlineeFrameInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                            ,0xd96,"(instr->m_func->cachedInlineeFrameInfo)",
                            "instr->m_func->cachedInlineeFrameInfo");
        if (!bVar11) goto LAB_0058f25c;
        *puVar12 = 0;
      }
      if (((this->currentBlock->inlineeStack).
           super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count == 0) ||
         (uVar1 = instr->m_func->inlineDepth,
         ppFVar13 = JsUtil::
                    List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Last(&this->currentBlock->inlineeStack), uVar1 == (*ppFVar13)->inlineDepth + 1
         )) goto LAB_0058f225;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                          ,0xd98,
                          "(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1)"
                          ,
                          "this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1"
                         );
      if (bVar11) {
        *puVar12 = 0;
        goto LAB_0058f225;
      }
      goto LAB_0058f25c;
    }
    bVar11 = IR::Instr::HasBailOnNoProfile(instr);
    if (!bVar11) {
      return;
    }
  }
  pFVar14 = instr->m_func;
  if ((*(uint *)&pFVar14->field_0x240 & 2) == 0) {
    if (pFVar14->parentFunc == (Func *)0x0) {
      return;
    }
    if ((pFVar14->parentFunc->field_0x240 & 2) == 0) {
      return;
    }
    if ((*(uint *)&pFVar14->field_0x240 & 2) == 0) {
      if (pFVar14->cachedInlineeFrameInfo == (InlineeFrameInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                            ,0xda3,"(instr->m_func->cachedInlineeFrameInfo)",
                            "instr->m_func->cachedInlineeFrameInfo");
        if (!bVar11) goto LAB_0058f25c;
        *puVar12 = 0;
      }
      instr->m_func->frameInfo = instr->m_func->cachedInlineeFrameInfo;
    }
  }
  pFVar14 = instr->m_func;
  pIVar3 = pFVar14->frameInfo;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(pFVar14->m_workItem);
  functionBodyAddr = JITTimeFunctionBody::GetAddr(this_00);
  InlineeFrameInfo::AllocateRecord(pIVar3,pFVar14,functionBodyAddr);
  pLVar9 = this->currentBlock;
  if ((pLVar9->inlineeStack).super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.
      count == 0) {
    if ((pLVar9->inlineeFrameLifetimes).
        super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                          ,0xdab,"(this->currentBlock->inlineeFrameLifetimes.Count() == 0)",
                          "this->currentBlock->inlineeFrameLifetimes.Count() == 0");
      if (!bVar11) goto LAB_0058f25c;
      *puVar12 = 0;
    }
    if ((this->currentBlock->inlineeFrameSyms).count ==
        (this->currentBlock->inlineeFrameSyms).freeCount) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
    ;
    error = "(this->currentBlock->inlineeFrameSyms.Count() == 0)";
    message = "this->currentBlock->inlineeFrameSyms.Count() == 0";
    lineNumber = 0xdac;
  }
  else {
    pFVar14 = JsUtil::
              List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::RemoveAtEnd(&pLVar9->inlineeStack);
    if (pFVar14 != instr->m_func) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                          ,0xdb1,"(func == instr->m_func)","func == instr->m_func");
      if (!bVar11) goto LAB_0058f25c;
      *puVar12 = 0;
    }
    if ((instr->m_func->field_0x240 & 2) == 0) {
      return;
    }
    pIVar3 = instr->m_func->frameInfo;
    value = (uint *)this;
    if ((pIVar3->function).type == InlineeFrameInfoValueType_Sym) {
      InlineeFrameInfo::
      IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3509:59)>
      ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                ((anon_class_8_1_8991fb9c_for_callback *)&value,(pIVar3->function).field_1.sym);
    }
    pAVar4 = pIVar3->arguments;
    uVar17 = (pAVar4->
             super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
             count - 1;
    local_40.this = this;
    if (-1 < (int)uVar17) {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar15 = (ulong)uVar17 * 0x18;
      lVar18 = (ulong)uVar17 + 1;
      do {
        pIVar5 = (pAVar4->
                 super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                 ).buffer;
        if (*(int *)((long)&pIVar5->type + lVar15) == 1) {
          InlineeFrameInfo::
          IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3509:59)>
          ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                    (&local_40,*(StackSym **)((long)&pIVar5->field_1 + lVar15));
        }
        if (*(int *)((long)&pIVar5->type + lVar15) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                              ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                              "value.type != InlineeFrameInfoValueType_None");
          if (!bVar11) goto LAB_0058f25c;
          *puVar12 = 0;
        }
        lVar15 = lVar15 + -0x18;
        lVar16 = lVar18 + -1;
        bVar11 = 0 < lVar18;
        lVar18 = lVar16;
      } while (lVar16 != 0 && bVar11);
    }
    if ((pIVar3->function).type != InlineeFrameInfoValueType_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
    ;
    error = "(function.type != InlineeFrameInfoValueType_None)";
    message = "function.type != InlineeFrameInfoValueType_None";
    lineNumber = 0xbf;
  }
  bVar11 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
  if (bVar11) {
    *puVar12 = 0;
    return;
  }
LAB_0058f25c:
  pcVar10 = (code *)invalidInstructionException();
  (*pcVar10)();
}

Assistant:

void LinearScan::TrackInlineeArgLifetimes(IR::Instr* instr)
{
    if (instr->m_opcode == Js::OpCode::InlineeStart)
    {
        if (instr->m_func->m_hasInlineArgsOpt)
        {
            instr->m_func->frameInfo->IterateSyms([=](StackSym* sym){
                Lifetime* lifetime = sym->scratch.linearScan.lifetime;
                this->currentBlock->inlineeFrameLifetimes.Add(lifetime);

                // We need to maintain as count because the same sym can be used for multiple arguments
                uint* value;
                if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                {
                    *value = *value + 1;
                }
                else
                {
                    this->currentBlock->inlineeFrameSyms.Add(sym->m_id, 1);
                }
            });
            if (this->currentBlock->inlineeStack.Count() > 0)
            {
                Assert(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth);
            }
            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
        else if (instr->m_func->GetParentFunc()->m_hasInlineArgsOpt)
        {
            Assert(!instr->m_func->frameInfo);
            Assert(instr->m_func->cachedInlineeFrameInfo);
            
            Assert(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1);

            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineeEnd || instr->HasBailOnNoProfile())
    {
        if (instr->m_func->m_hasInlineArgsOpt || (instr->m_func->GetParentFunc() && instr->m_func->GetParentFunc()->m_hasInlineArgsOpt))
        {
            if (!instr->m_func->m_hasInlineArgsOpt)
            {
                Assert(instr->m_func->cachedInlineeFrameInfo);
                instr->m_func->frameInfo = instr->m_func->cachedInlineeFrameInfo;
            }
            instr->m_func->frameInfo->AllocateRecord(instr->m_func, instr->m_func->GetJITFunctionBody()->GetAddr());

            if(this->currentBlock->inlineeStack.Count() == 0)
            {
                // Block is unreachable
                Assert(this->currentBlock->inlineeFrameLifetimes.Count() == 0);
                Assert(this->currentBlock->inlineeFrameSyms.Count() == 0);
            }
            else
            {
                Func* func = this->currentBlock->inlineeStack.RemoveAtEnd();
                Assert(func == instr->m_func);

                if (instr->m_func->m_hasInlineArgsOpt)
                {
                    instr->m_func->frameInfo->IterateSyms([=](StackSym* sym) {
                        Lifetime* lifetime = this->currentBlock->inlineeFrameLifetimes.RemoveAtEnd();

                        uint* value;
                        if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                        {
                            *value = *value - 1;
                            if (*value == 0)
                            {
                                bool removed = this->currentBlock->inlineeFrameSyms.Remove(sym->m_id);
                                Assert(removed);
                            }
                        }
                        else
                        {
                            Assert(UNREACHED);
                        }
                        Assert(sym->scratch.linearScan.lifetime == lifetime);
                        }, /*reverse*/ true);
                }
            }
        }
    }
}